

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<char,_false,_false>::grow_and_add
          (FastVector<char,_false,_false> *this,uint newSize,char *valPtr,uint elem)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *ptr;
  uint local_38;
  uint i;
  uint oldMax;
  char *oldData;
  uint elem_local;
  char *valPtr_local;
  uint newSize_local;
  FastVector<char,_false,_false> *this_local;
  
  ptr = this->data;
  uVar2 = this->max;
  grow_no_destroy(this,newSize);
  for (local_38 = 0; local_38 < elem; local_38 = local_38 + 1) {
    cVar1 = valPtr[local_38];
    uVar3 = this->count;
    this->count = uVar3 + 1;
    this->data[uVar3] = cVar1;
  }
  if (ptr != (char *)0x0) {
    NULLC::destruct<char>(ptr,(ulong)uVar2);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T* valPtr, unsigned elem)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		for(unsigned i = 0; i < elem; i++)
			data[count++] = valPtr[i];

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}